

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O3

int __thiscall
lodepng::ExtractZlib::decompress
          (ExtractZlib *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in)

{
  byte *pbVar1;
  int iVar2;
  
  pbVar1 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = 0x35;
  if (1 < (ulong)((long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pbVar1)) {
    iVar2 = 0x18;
    if ((((ushort)(CONCAT11(*pbVar1,pbVar1[1]) * 0x7bdf) < 0x843) &&
        (iVar2 = 0x19, (*pbVar1 & 0x8f) == 8)) && (iVar2 = 0x1a, (pbVar1[1] & 0x20) == 0)) {
      inflate(this,out,in,2);
      iVar2 = this->error;
    }
  }
  return iVar2;
}

Assistant:

int decompress(std::vector<unsigned char>& out, const std::vector<unsigned char>& in) { //returns error value
    if(in.size() < 2) { return 53; } //error, size of zlib data too small
    //error: 256 * in[0] + in[1] must be a multiple of 31, the FCHECK value is supposed to be made that way
    if((in[0] * 256 + in[1]) % 31 != 0) { return 24; }
    unsigned long CM = in[0] & 15, CINFO = (in[0] >> 4) & 15, FDICT = (in[1] >> 5) & 1;
    //error: only compression method 8: inflate with sliding window of 32k is supported by the PNG spec
    if(CM != 8 || CINFO > 7) { return 25; }
    //error: the PNG spec says about the zlib stream: "The additional flags shall not specify a preset dictionary."
    if(FDICT != 0) { return 26; }
    inflate(out, in, 2);
    return error; //note: adler32 checksum was skipped and ignored
  }